

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::WeightParams::ByteSizeLong(WeightParams *this)

{
  long lVar1;
  string *psVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  int value;
  
  uVar3 = (ulong)(uint)(this->floatvalue_).current_size_;
  lVar1 = uVar3 * 4;
  if (uVar3 == 0) {
    value = 0;
    lVar6 = 0;
  }
  else {
    value = (int)lVar1;
    sVar4 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar6 = sVar4 + 1;
  }
  this->_floatvalue_cached_byte_size_ = value;
  sVar4 = lVar6 + lVar1;
  psVar2 = (this->float16value_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::BytesSize(psVar2);
    sVar4 = sVar4 + sVar5 + 1;
  }
  psVar2 = (this->rawvalue_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::BytesSize(psVar2);
    sVar4 = sVar4 + sVar5 + 2;
  }
  psVar2 = (this->int8rawvalue_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::BytesSize(psVar2);
    sVar4 = sVar4 + sVar5 + 2;
  }
  if (this->quantization_ != (QuantizationParams *)0x0 &&
      this != (WeightParams *)&_WeightParams_default_instance_) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::QuantizationParams>(this->quantization_);
    sVar4 = sVar4 + sVar5 + 2;
  }
  sVar5 = sVar4 + 3;
  if (this->isupdatable_ == false) {
    sVar5 = sVar4;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t WeightParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.WeightParams)
  size_t total_size = 0;

  // repeated float floatValue = 1;
  {
    unsigned int count = this->floatvalue_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _floatvalue_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // bytes float16Value = 2;
  if (this->float16value().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->float16value());
  }

  // bytes rawValue = 30;
  if (this->rawvalue().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->rawvalue());
  }

  // bytes int8RawValue = 31;
  if (this->int8rawvalue().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->int8rawvalue());
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->has_quantization()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->quantization_);
  }

  // bool isUpdatable = 50;
  if (this->isupdatable() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}